

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringUtil.hpp
# Opt level: O2

string * limonp::RTrim(string *s)

{
  pointer pcVar1;
  unary_negate<std::pointer_to_unary_function<unsigned_int,_bool>_> __pred;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  
  pcVar1 = (s->_M_dataplus)._M_p;
  __pred._M_pred._M_ptr = (_func_bool_uint *)(pcVar1 + s->_M_string_length);
  __pred._0_8_ = pcVar1;
  std::
  find_if<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,std::unary_negate<std::pointer_to_unary_function<unsigned_int,bool>>>
            ((reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&local_18,
             (reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)&stack0xffffffffffffffe0,__pred);
  std::__cxx11::string::erase(s,local_18._M_current,(s->_M_dataplus)._M_p + s->_M_string_length);
  return s;
}

Assistant:

inline std::string& RTrim(std::string &s) {
  s.erase(std::find_if(s.rbegin(), s.rend(), std::not1(std::ptr_fun<unsigned, bool>(IsSpace))).base(), s.end());
  return s;
}